

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command.cpp
# Opt level: O2

void __thiscall Command_NoCalls_Test::TestBody(Command_NoCalls_Test *this)

{
  mock_cp *this_00;
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *pTVar1;
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *pFVar2;
  MatcherBase<const_pstore::broker::broker_command_&> local_c8;
  MatcherBase<const_pstore::brokerface::fifo_path_&> local_b0;
  MatcherBase<const_pstore::broker::broker_command_&> local_98;
  MatcherBase<const_pstore::brokerface::fifo_path_&> local_80;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_68;
  
  this_00 = &(this->super_Command).cp_;
  local_80.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189790;
  local_98.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_98.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189830;
  pFVar2 = &(this->super_Command).cp_.gmock02_suicide_42;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::Matcher
            ((Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
             (Matcher<const_pstore::brokerface::fifo_path_&> *)&local_80);
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_c8,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_98);
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_68,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_c8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_c8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_b0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_68,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x59,"cp ()","suicide (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~_Tuple_impl(&local_68.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
                );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_98);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_80);
  local_80.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189790;
  local_98.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_98.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189830;
  pFVar2 = &(this->super_Command).cp_.gmock02_quit_44;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::Matcher
            ((Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
             (Matcher<const_pstore::brokerface::fifo_path_&> *)&local_80);
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_c8,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_98);
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_68,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_c8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_c8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_b0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_68,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5a,"cp ()","quit (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~_Tuple_impl(&local_68.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
                );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_98);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_80);
  local_80.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189790;
  local_98.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_98.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189830;
  pFVar2 = &(this->super_Command).cp_.gmock02_cquit_46;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::Matcher
            ((Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
             (Matcher<const_pstore::brokerface::fifo_path_&> *)&local_80);
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_c8,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_98);
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_68,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_c8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_c8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_b0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_68,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5b,"cp ()","cquit (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~_Tuple_impl(&local_68.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
                );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_98);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_80);
  local_80.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189790;
  local_98.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_98.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189830;
  pFVar2 = &(this->super_Command).cp_.gmock02_gc_48;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::Matcher
            ((Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
             (Matcher<const_pstore::brokerface::fifo_path_&> *)&local_80);
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_c8,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_98);
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_68,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_c8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_c8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_b0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_68,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5c,"cp ()","gc (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~_Tuple_impl(&local_68.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
                );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_98);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_80);
  local_80.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189790;
  local_98.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_98.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189830;
  pFVar2 = &(this->super_Command).cp_.gmock02_echo_50;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::Matcher
            ((Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
             (Matcher<const_pstore::brokerface::fifo_path_&> *)&local_80);
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_c8,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_98);
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_68,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_c8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_c8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_b0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_68,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5d,"cp ()","echo (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~_Tuple_impl(&local_68.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
                );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_98);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_80);
  local_b0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_b0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189790;
  local_c8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_c8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189830;
  anon_unknown.dwarf_21ba7::mock_cp::gmock_nop
            (&local_68,this_00,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_b0,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_c8);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_68,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5e,"cp ()","nop (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~_Tuple_impl(&local_68.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
                );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_c8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_b0);
  return;
}

Assistant:

TEST_F (Command, NoCalls) {
    using ::testing::_;
    EXPECT_CALL (cp (), suicide (_, _)).Times (0);
    EXPECT_CALL (cp (), quit (_, _)).Times (0);
    EXPECT_CALL (cp (), cquit (_, _)).Times (0);
    EXPECT_CALL (cp (), gc (_, _)).Times (0);
    EXPECT_CALL (cp (), echo (_, _)).Times (0);
    EXPECT_CALL (cp (), nop (_, _)).Times (0);
}